

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

idx_t __thiscall duckdb::Binder::GetBinderDepth(Binder *this)

{
  idx_t depth;
  idx_t iVar1;
  
  iVar1 = 1;
  while ((this->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr != (element_type *)0x0) {
    iVar1 = iVar1 + 1;
    this = shared_ptr<duckdb::Binder,_true>::operator*(&this->parent);
  }
  return iVar1;
}

Assistant:

idx_t Binder::GetBinderDepth() const {
	const_reference<Binder> root = *this;
	idx_t depth = 1;
	while (root.get().parent) {
		depth++;
		root = *root.get().parent;
	}
	return depth;
}